

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall
Board::draw_board(Board *this,set<Point,_std::less<Point>,_std::allocator<Point>_> *options,
                 Color color,uint turn)

{
  uchar uVar1;
  char cVar2;
  const_iterator cVar3;
  iterator iVar4;
  dimension x;
  short sVar5;
  int iVar6;
  uchar background;
  int iVar7;
  Point local_9c;
  Point local_98;
  int local_94;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> *local_90;
  _Base_ptr local_88;
  string local_80;
  set<Point,_std::less<Point>,_std::allocator<Point>_> threatened;
  
  local_90 = &options->_M_t;
  std::operator<<((ostream *)&std::cout,"  ");
  for (sVar5 = -8; sVar5 != 0; sVar5 = sVar5 + 1) {
    print_char_index((char)sVar5 + 'I');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  get_threatened(&threatened,this,color,turn);
  local_88 = &(((_Rep_type *)&local_90->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  for (iVar7 = 7; -1 < iVar7; iVar7 = iVar7 + -1) {
    sVar5 = (short)iVar7;
    local_94 = (int)(short)(sVar5 + 1);
    print_index(sVar5 + 1);
    for (iVar6 = 0; iVar6 != 8; iVar6 = iVar6 + 1) {
      x = (dimension)iVar6;
      Point::Point((Point *)&local_80,x,sVar5);
      if (*(long *)(*(long *)&(this->m_board).m_data.
                              super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start
                              [(short)local_80._M_dataplus._M_p].
                              super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                   + (long)local_80._M_dataplus._M_p._2_2_ * 0x10) == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"  ",(allocator<char> *)&local_9c);
        print_colorful(&local_80,'\0',((char)iVar7 + (char)iVar6 & 1U) * '\x02' + 0xf3);
      }
      else {
        Point::Point((Point *)&local_80,x,sVar5);
        cVar3 = std::
                _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                ::find(local_90,(key_type *)&local_80);
        if (cVar3._M_node == local_88) {
          background = ((char)iVar7 + (char)iVar6 & 1U) * '\x02' + 0xf3;
        }
        else {
          Point::Point((Point *)&local_80,x,sVar5);
          iVar4 = std::
                  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                  ::find(&threatened._M_t,(key_type *)&local_80);
          if ((_Rb_tree_header *)iVar4._M_node == &threatened._M_t._M_impl.super__Rb_tree_header) {
            background = '\"';
            uVar1 = '\x1c';
          }
          else {
            background = 0xa0;
            uVar1 = '|';
          }
          if ((iVar7 + iVar6 & 1U) == 0) {
            background = uVar1;
          }
        }
        Point::Point(&local_9c,x,sVar5);
        (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                           super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_9c.m_x].
                                           super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                + (long)local_9c.m_y * 0x10) + 0x18))(&local_80);
        Point::Point(&local_98,x,sVar5);
        cVar2 = (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                                                                                      
                                                  super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_98.m_x].
                                                  super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                        + (long)local_98.m_y * 0x10) + 0x20))();
        print_colorful(&local_80,-cVar2,background);
      }
      std::__cxx11::string::~string((string *)&local_80);
    }
    print_index((dimension)local_94);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::operator<<((ostream *)&std::cout,"  ");
  for (sVar5 = -8; sVar5 != 0; sVar5 = sVar5 + 1) {
    print_char_index((char)sVar5 + 'I');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
  ~_Rb_tree(&threatened._M_t);
  return;
}

Assistant:

void Board::draw_board(const set<Point> &options, Color color, unsigned int turn) const {
    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
    unsigned char background;

#if DISPLAY_THREATENED
    auto threatened = get_threatened(color, turn);
#endif // DISPLAY_THREATENED

    for (dimension i = SIZE - 1; i >= 0; i--) {
        print_index(i + 1);
        for (dimension j = 0; j < SIZE; j++) {
            if (m_board[{j, i}] == nullptr) {
                print_colorful("  ", 0, ((i + j) % 2 ? colors::light_gray : colors::dark_gray));
                continue;
            }
#if DISPLAY_HINTS
            if ((options.find({j, i}) != options.end())) {
#if DISPLAY_THREATENED
                if (threatened.find({j, i}) != threatened.end()) {
                    background = (i + j) % 2 ? colors::light_red : colors::dark_red;
                } else {
#endif // DISPLAY_THREATENED
#endif // DISPLAY_HINTS
                    background = (i + j) % 2 ? colors::light_green : colors::dark_green;
#if DISPLAY_THREATENED
                }
#endif // DISPLAY_THREATENED
#if DISPLAY_HINTS
            } else {
                background = (i + j) % 2 ? colors::light_gray : colors::dark_gray;
            }
#endif // DISPLAY_HINTS
            print_colorful(m_board[{j, i}]->get_representation(),
                           (m_board[{j, i}]->get_color()) ? colors::white : colors::black, background);
        }
        print_index(i + 1);
        cout << endl;
    }

    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
}

void Board::draw_board(const set<Point> &possible_moves, const map<Point, play> &possible_plays, const Point &chosen,
                       unsigned int turn) {
    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
    unsigned char background;

#if DISPLAY_THREATENED
    auto threatened = get_threatened(possible_moves, possible_plays, chosen, turn);
#endif // DISPLAY_THREATENED

    for (dimension i = SIZE - 1; i >= 0; i--) {
        print_index(i + 1);
        for (dimension j = 0; j < SIZE; j++) {
            if (Point(j, i) == chosen) {
                background = 220;
#if DISPLAY_HINTS
            } else if ((possible_moves.find({j, i}) == possible_moves.end())) {
#else
                }
#endif // DISPLAY_HINTS
                background = (i + j) % 2 ? colors::light_gray : colors::dark_gray;
#if DISPLAY_HINTS
            } else {
#if DISPLAY_THREATENED
                if (threatened.find({j, i}) != threatened.end()) {
                    background = (i + j) % 2 ? colors::light_red : colors::dark_red;
                } else {
#endif // DISPLAY_THREATENED
                    background = (i + j) % 2 ? colors::light_green : colors::dark_green;
#if DISPLAY_THREATENED
                }
#endif // DISPLAY_THREATENED
            }
#endif // DISPLAY_HINTS

            if (m_board[{j, i}] == nullptr) {
                print_colorful("  ", colors::black, background);
            } else {
                print_colorful(m_board[{j, i}]->get_representation(),
                               (m_board[{j, i}]->get_color()) ? colors::white : colors::black, background);
            }
        }
        print_index(i + 1);
        cout << endl;
    }

    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
}